

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractspinbox.cpp
# Opt level: O0

QVariant * operator-(QVariant *arg1,QVariant *arg2)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int *piVar8;
  bool *in_RDX;
  QVariant *in_RSI;
  QVariant *in_RDI;
  long in_FS_OFFSET;
  QVariant *this;
  double dVar9;
  int msecs;
  int secs;
  int days;
  QVariant *ret;
  QDateTime dt;
  QDateTime a2;
  QDateTime a1;
  char *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee4;
  QVariant *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  undefined4 local_bc;
  QDateTime local_b8 [8];
  undefined1 *local_b0;
  undefined4 local_a8;
  undefined4 local_a4;
  int local_a0 [2];
  undefined1 *local_98;
  undefined1 *local_90;
  char local_88 [32];
  QVariant local_68;
  QVariant local_48;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).data.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)((long)&(in_RDI->d).data + 8) = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)((long)&(in_RDI->d).data + 0x10) = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&(in_RDI->d).field_0x18 = &DAT_aaaaaaaaaaaaaaaa;
  QVariant::QVariant((QVariant *)0x68c54d);
  iVar1 = QVariant::userType((QVariant *)0x68c557);
  iVar2 = QVariant::userType((QVariant *)0x68c565);
  if (iVar1 != iVar2) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
               (char *)in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,in_stack_fffffffffffffed8
              );
    uVar6 = QVariant::typeName();
    uVar7 = QVariant::typeName();
    QMessageLogger::warning
              (local_88,"QAbstractSpinBox: Internal error: Different types (%s vs %s) (%s:%d)",uVar6
               ,uVar7,
               "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/widgets/widgets/qabstractspinbox.cpp"
               ,0x7fa);
  }
  iVar1 = QVariant::userType((QVariant *)0x68c5de);
  if (iVar1 == 2) {
    iVar1 = QVariant::toInt((bool *)in_RSI);
    iVar2 = QVariant::toInt(in_RDX);
    QVariant::QVariant(&local_28,iVar1 - iVar2);
    QVariant::operator=(in_stack_fffffffffffffee8,
                        (QVariant *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
    QVariant::~QVariant(&local_28);
  }
  else if (iVar1 == 6) {
    this = (QVariant *)QVariant::toDouble((bool *)in_RSI);
    dVar9 = (double)QVariant::toDouble(in_RDX);
    QVariant::QVariant(&local_48,(double)this - dVar9);
    QVariant::operator=(this,(QVariant *)
                             CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
    QVariant::~QVariant(&local_48);
  }
  else if (iVar1 == 0x10) {
    local_90 = &DAT_aaaaaaaaaaaaaaaa;
    QVariant::toDateTime();
    local_98 = &DAT_aaaaaaaaaaaaaaaa;
    QVariant::toDateTime();
    iVar2 = QDateTime::daysTo((QDateTime *)&local_98);
    iVar3 = QDateTime::secsTo((QDateTime *)&local_98);
    local_a0[1] = 0;
    local_a4 = QDateTime::time();
    iVar4 = QTime::msec();
    local_a8 = QDateTime::time();
    local_a0[0] = QTime::msec();
    local_a0[0] = iVar4 - local_a0[0];
    piVar8 = qMax<int>(local_a0 + 1,local_a0);
    iVar1 = *piVar8;
    if (((iVar2 < 0) || (iVar3 < 0)) || (iVar1 < 0)) {
      QVariant::operator=(in_RDI,in_RSI);
    }
    else {
      local_b0 = &DAT_aaaaaaaaaaaaaaaa;
      QDateTime::addDays((longlong)local_b8);
      QDateTime::addSecs((longlong)&local_b0);
      QDateTime::~QDateTime(local_b8);
      if (0 < iVar1) {
        local_bc = QDateTime::time();
        uVar5 = QTime::addMSecs((int)&local_bc);
        QDateTime::setTime(&local_b0,uVar5,1);
      }
      QVariant::QVariant(&local_68,(QDateTime *)&local_b0);
      QVariant::operator=(in_stack_fffffffffffffee8,
                          (QVariant *)CONCAT44(iVar4,in_stack_fffffffffffffee0));
      QVariant::~QVariant(&local_68);
      QDateTime::~QDateTime((QDateTime *)&local_b0);
    }
    QDateTime::~QDateTime((QDateTime *)&local_98);
    QDateTime::~QDateTime((QDateTime *)&local_90);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QVariant operator-(const QVariant &arg1, const QVariant &arg2)
{
    QVariant ret;
    if (Q_UNLIKELY(arg1.userType() != arg2.userType()))
        qWarning("QAbstractSpinBox: Internal error: Different types (%s vs %s) (%s:%d)",
                 arg1.typeName(), arg2.typeName(), __FILE__, __LINE__);
    switch (arg1.userType()) {
    case QMetaType::Int: ret = QVariant(arg1.toInt() - arg2.toInt()); break;
    case QMetaType::Double: ret = QVariant(arg1.toDouble() - arg2.toDouble()); break;
    case QMetaType::QDateTime: {
        QDateTime a1 = arg1.toDateTime();
        QDateTime a2 = arg2.toDateTime();
        int days = a2.daysTo(a1);
        int secs = a2.secsTo(a1);
        int msecs = qMax(0, a1.time().msec() - a2.time().msec());
        if (days < 0 || secs < 0 || msecs < 0) {
            ret = arg1;
        } else {
            QDateTime dt = a2.addDays(days).addSecs(secs);
            if (msecs > 0)
                dt.setTime(dt.time().addMSecs(msecs));
            ret = QVariant(dt);
        }
        break;
    }
    default: break;
    }
    return ret;
}